

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::flags_internal::AbslParseFlag
          (flags_internal *this,string_view text,short *dst,string *param_3)

{
  string_view text_00;
  bool bVar1;
  int local_34;
  short *psStack_30;
  int val;
  string *param_2_local;
  short *dst_local;
  string_view text_local;
  
  param_2_local = (string *)text._M_str;
  text_local._M_len = text._M_len;
  text_00._M_str = (char *)text_local._M_len;
  text_00._M_len = (size_t)this;
  psStack_30 = dst;
  dst_local = (short *)this;
  bVar1 = ParseFlagImpl<int>(text_00,&local_34);
  if (bVar1) {
    if ((short)local_34 == local_34) {
      *(short *)param_2_local = (short)local_34;
      text_local._M_str._7_1_ = true;
    }
    else {
      text_local._M_str._7_1_ = false;
    }
  }
  else {
    text_local._M_str._7_1_ = false;
  }
  return text_local._M_str._7_1_;
}

Assistant:

bool AbslParseFlag(absl::string_view text, short* dst, std::string*) {
  int val;
  if (!ParseFlagImpl(text, val)) return false;
  if (static_cast<short>(val) != val)  // worked, but number out of range
    return false;
  *dst = static_cast<short>(val);
  return true;
}